

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EXDos.cpp
# Opt level: O0

uint8_t __thiscall Enterprise::EXDos::get_control_register(EXDos *this)

{
  bool bVar1;
  byte bVar2;
  Drive *this_00;
  byte bVar3;
  byte bVar4;
  uint8_t status;
  EXDos *this_local;
  
  bVar1 = WD::WD1770::get_data_request_line(&this->super_WD1770);
  bVar2 = 0;
  if (bVar1) {
    bVar2 = 0x80;
  }
  bVar3 = 0;
  if ((this->disk_did_change_ & 1U) != 0) {
    bVar3 = 0x40;
  }
  bVar1 = WD::WD1770::get_interrupt_request_line(&this->super_WD1770);
  bVar4 = 0;
  if (bVar1) {
    bVar4 = 2;
  }
  this_00 = Storage::Disk::Controller::get_drive((Controller *)this);
  bVar1 = Storage::Disk::Drive::get_is_ready(this_00);
  return bVar2 | bVar3 | bVar4 | bVar1;
}

Assistant:

uint8_t EXDos::get_control_register() {
	const uint8_t status =
		(get_data_request_line() ? 0x80 : 0x00) |
		(disk_did_change_ ? 0x40 : 0x00) |
		(get_interrupt_request_line() ? 0x02 : 0x00) |
		(get_drive().get_is_ready() ? 0x01 : 0x00);

	return status;
}